

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astc_codec.cpp
# Opt level: O1

astcenc_swizzle astcSwizzle(ktxAstcParams *params)

{
  byte bVar1;
  size_t sVar2;
  int i;
  long lVar3;
  undefined8 uVar4;
  astcenc_swz aVar5;
  ulong uVar6;
  ulong uVar7;
  astcenc_swizzle aVar8;
  initializer_list<astcenc_swz_*> __l;
  astcenc_swizzle swizzle;
  vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_> swizzle_array;
  string inputSwizzle;
  allocator_type local_69;
  undefined8 local_68;
  undefined8 uStack_60;
  vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_> local_58;
  undefined8 **local_40;
  long local_38;
  undefined8 *local_30;
  long local_28;
  
  local_40 = (undefined8 **)&local_68;
  local_68 = 0x100000000;
  uStack_60 = 0x300000002;
  local_38 = (long)&local_68 + 4;
  local_30 = &uStack_60;
  local_28 = (long)&uStack_60 + 4;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_40;
  std::vector<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>::vector(&local_58,__l,&local_69);
  local_40 = &local_30;
  sVar2 = strlen(params->inputSwizzle);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,params->inputSwizzle,params->inputSwizzle + sVar2);
  if (local_38 == 0) {
    if (params->normalMap != false) {
      uVar4 = 0x100000000;
      uVar6 = 0;
      uVar7 = 0;
      goto LAB_0020223f;
    }
  }
  else {
    if (local_38 != 4) {
      __assert_fail("inputSwizzle.size() == 4 && \"InputSwizzle is invalid.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                    ,0x1ae,"astcenc_swizzle astcSwizzle(const ktxAstcParams &)");
    }
    lVar3 = 0;
    do {
      bVar1 = *(byte *)((long)local_40 + lVar3);
      if (bVar1 < 0x62) {
        if (bVar1 == 0x30) {
          aVar5 = ASTCENC_SWZ_0;
          goto LAB_002021fc;
        }
        if (bVar1 == 0x31) {
          aVar5 = ASTCENC_SWZ_1;
          goto LAB_002021fc;
        }
        if (bVar1 == 0x61) {
          aVar5 = ASTCENC_SWZ_A;
          goto LAB_002021fc;
        }
      }
      else {
        if (bVar1 == 0x62) {
          aVar5 = ASTCENC_SWZ_B;
        }
        else {
          aVar5 = ASTCENC_SWZ_R;
          if (bVar1 != 0x72) {
            if (bVar1 != 0x67) goto LAB_00202202;
            aVar5 = ASTCENC_SWZ_G;
          }
        }
LAB_002021fc:
        *local_58.super__Vector_base<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>._M_impl.
         super__Vector_impl_data._M_start[lVar3] = aVar5;
      }
LAB_00202202:
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
  }
  uVar7 = local_68 & 0xffffffff00000000;
  uVar6 = local_68 & 0xffffffff;
  uVar4 = uStack_60;
LAB_0020223f:
  if (local_40 != &local_30) {
    operator_delete(local_40,(long)local_30 + 1);
  }
  if (local_58.super__Vector_base<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<astcenc_swz_*,_std::allocator<astcenc_swz_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  aVar8.b = (int)uVar4;
  aVar8.a = (int)((ulong)uVar4 >> 0x20);
  aVar8.r = (int)(uVar7 | uVar6);
  aVar8.g = (int)((uVar7 | uVar6) >> 0x20);
  return aVar8;
}

Assistant:

static astcenc_swizzle
astcSwizzle(const ktxAstcParams &params) {

    astcenc_swizzle swizzle{ASTCENC_SWZ_R, ASTCENC_SWZ_G, ASTCENC_SWZ_B, ASTCENC_SWZ_A};

    std::vector<astcenc_swz*> swizzle_array{&swizzle.r, &swizzle.g, &swizzle.b, &swizzle.a};
    std::string inputSwizzle = params.inputSwizzle;

    if (inputSwizzle.size() > 0) {
        assert(inputSwizzle.size() == 4 && "InputSwizzle is invalid.");

        for (int i = 0; i < 4; i++) {
            if (inputSwizzle[i] == 'r')
                *swizzle_array[i] = ASTCENC_SWZ_R;
            else if (inputSwizzle[i] == 'g')
                *swizzle_array[i] = ASTCENC_SWZ_G;
            else if (inputSwizzle[i] == 'b')
                *swizzle_array[i] = ASTCENC_SWZ_B;
            else if (inputSwizzle[i] == 'a')
                *swizzle_array[i] = ASTCENC_SWZ_A;
            else if (inputSwizzle[i] == '0')
                *swizzle_array[i] = ASTCENC_SWZ_0;
            else if (inputSwizzle[i] == '1')
                *swizzle_array[i] = ASTCENC_SWZ_1;
        }
    } else if (params.normalMap) {
        return {ASTCENC_SWZ_R, ASTCENC_SWZ_R, ASTCENC_SWZ_R, ASTCENC_SWZ_G};
    }

    return swizzle;
}